

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.h
# Opt level: O2

void __thiscall LTFlightData::FDKeyTy::FDKeyTy(FDKeyTy *this,FDKeyType _eType,unsigned_long _num)

{
  string local_30;
  
  this->eKeyType = KEY_UNKNOWN;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  this->num = 0;
  SetKey_abi_cxx11_(&local_30,this,_eType,_num);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

FDKeyTy(FDKeyType _eType, unsigned long _num)                   { SetKey(_eType,_num); }